

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_set_operation.cpp
# Opt level: O2

JoinCondition *
duckdb::CreateNotDistinctComparison(JoinCondition *__return_storage_ptr__,LogicalType *type,idx_t i)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  idx_t local_18;
  
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  local_18 = i;
  make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long&>
            ((duckdb *)&local_20,type,&local_18);
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)local_20._M_head_impl;
  make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long&>
            ((duckdb *)&local_20,type,&local_18);
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_20._M_head_impl;
  __return_storage_ptr__->comparison = COMPARE_BOUNDARY_END;
  return __return_storage_ptr__;
}

Assistant:

static JoinCondition CreateNotDistinctComparison(const LogicalType &type, idx_t i) {
	JoinCondition cond;
	cond.left = make_uniq<BoundReferenceExpression>(type, i);
	cond.right = make_uniq<BoundReferenceExpression>(type, i);
	cond.comparison = ExpressionType::COMPARE_NOT_DISTINCT_FROM;
	return cond;
}